

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void pop_activation_record_from_stack(CManager_conflict cm,ev_handler_activation_ptr rec)

{
  _event_path_data *p_Var1;
  _ev_handler_activation_rec *p_Var2;
  pthread_t pVar3;
  ev_handler_activation_ptr p_Var4;
  char *__s;
  
  p_Var1 = cm->evp;
  pVar3 = pthread_self();
  p_Var4 = p_Var1->activation_stack;
  if (p_Var4 == (ev_handler_activation_ptr)0x0) {
    __s = "Activation stack inconsistency!  No records!";
LAB_001355e3:
    puts(__s);
    return;
  }
  if (p_Var4->thread_id == pVar3) {
    p_Var2 = p_Var4->next;
    p_Var1->activation_stack = p_Var2;
    if (p_Var2 != (_ev_handler_activation_rec *)0x0) {
      p_Var2->prev = (_ev_handler_activation_rec *)0x0;
    }
  }
  else {
    do {
      p_Var4 = p_Var4->next;
      if (p_Var4 == (_ev_handler_activation_rec *)0x0) {
        __s = "Activation stack inconsistency!  Record with thread ID now found!";
        goto LAB_001355e3;
      }
    } while (p_Var4->thread_id != pVar3);
    p_Var2 = p_Var4->prev;
    p_Var2->next = p_Var4->next;
    if (p_Var4->next != (_ev_handler_activation_rec *)0x0) {
      p_Var4->next->prev = p_Var2;
    }
  }
  return;
}

Assistant:

static void
pop_activation_record_from_stack(CManager cm, ev_handler_activation_ptr rec)
{
    event_path_data evp = cm->evp;
    ev_handler_activation_ptr tmp;
    thr_thread_id self = thr_thread_self();
    if (!evp->activation_stack) {
	printf("Activation stack inconsistency!  No records!\n"); 
	return;
    }
    if (evp->activation_stack->thread_id == self) {
	evp->activation_stack = evp->activation_stack->next;
	if (evp->activation_stack) {
	    evp->activation_stack->prev = NULL;
	}
	return;
    }
    tmp = evp->activation_stack->next;
    while(tmp) {
	if (tmp->thread_id == self) {
	    tmp->prev->next = tmp->next;
	    if (tmp->next) {
		tmp->next->prev = tmp->prev;
	    }
	    return;
	}
	tmp = tmp->next;
    }
    printf("Activation stack inconsistency!  Record with thread ID now found!\n"); 
}